

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathStrokeTests::HorizontalLineIsTransformedToARect(PathStrokeTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cap *pcVar3;
  FailedAssertion *pFVar4;
  long lVar5;
  stroke s;
  undefined1 local_218 [8];
  undefined4 local_210;
  undefined8 local_20c;
  undefined4 local_204;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f4;
  undefined4 local_1ec;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined8 local_1dc;
  undefined4 local_1d4;
  point local_1c8;
  undefined8 local_1bc;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined4 local_1a8;
  undefined8 local_1a4;
  undefined4 local_19c;
  undefined8 local_198;
  undefined4 local_190;
  undefined8 local_18c;
  undefined4 local_184;
  stroke local_180;
  undefined1 local_128 [44];
  int local_fc;
  pointer local_f8;
  int local_f0;
  pointer local_ec;
  int local_e4;
  LocationInfo local_e0;
  point local_b8;
  real_t local_ac;
  real_t rStack_a8;
  int local_a4;
  point local_a0;
  point local_94;
  point local_88;
  point local_7c;
  string local_70;
  string local_50;
  
  stroke::stroke(&local_180);
  stroke::width(&local_180,2.1);
  pcVar3 = (cap *)operator_new(8);
  pcVar3->_vptr_cap = (_func_int **)&PTR__cap_001c3288;
  if (local_180._cap != (cap *)0x0) {
    (*(local_180._cap)->_vptr_cap[1])();
  }
  local_180._cap = pcVar3;
  stroke::add_vertex(&local_180,1.3,5.81,1);
  stroke::add_vertex(&local_180,7.1,5.81,2);
  local_1c8.command = 0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_b8.command = stroke::vertex(&local_180,&local_1c8.x,&local_1c8.y);
  local_b8.x = local_1c8.x;
  local_b8.y = local_1c8.y;
  local_1c8.command = 0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_a4 = stroke::vertex(&local_180,&local_1c8.x,&local_1c8.y);
  local_ac = local_1c8.x;
  rStack_a8 = local_1c8.y;
  local_1c8.command = 0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_a0.command = stroke::vertex(&local_180,&local_1c8.x,&local_1c8.y);
  local_a0.x = local_1c8.x;
  local_a0.y = local_1c8.y;
  local_1c8.command = 0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_94.command = stroke::vertex(&local_180,&local_1c8.x,&local_1c8.y);
  local_94.x = local_1c8.x;
  local_94.y = local_1c8.y;
  local_1c8.command = 0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_88.command = stroke::vertex(&local_180,&local_1c8.x,&local_1c8.y);
  local_88.x = local_1c8.x;
  local_88.y = local_1c8.y;
  local_1c8.command = 0;
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_7c.command = stroke::vertex(&local_180,&local_1c8.x,&local_1c8.y);
  local_7c.x = local_1c8.x;
  local_7c.y = local_1c8.y;
  local_1c8.x = 1.3;
  local_1c8.y = 6.86;
  local_1c8.command = 1;
  local_1bc = 0x409851ec3fa66666;
  local_1b4 = 2;
  local_1b0 = 0x409851ec40e33333;
  local_1a8 = 2;
  local_1a4 = 0x40db851f40e33333;
  local_19c = 2;
  local_198 = 0;
  local_190 = 0x30;
  local_18c = 0;
  local_184 = 0;
  paVar1 = &local_e0.filename.field_2;
  local_e0.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_128,&local_e0.filename,0x6d);
  lVar5 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_1c8.x + lVar5),(point *)((long)&local_b8.x + lVar5));
    if (!bVar2) {
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_218 = (undefined1  [8])((long)&local_20c + 4);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_218,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,(string *)local_218,(LocationInfo *)local_128);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x48);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.filename._M_dataplus._M_p);
  }
  stroke::width(&local_180,1.5);
  stroke::remove_all(&local_180);
  stroke::add_vertex(&local_180,108.3,-15.1,1);
  stroke::add_vertex(&local_180,-5.0,-15.1,2);
  local_210 = 0;
  local_218 = (undefined1  [8])0x0;
  local_128._8_4_ = stroke::vertex(&local_180,(real_t *)local_218,(real_t *)(local_218 + 4));
  local_128._0_8_ = local_218;
  local_210 = 0;
  local_218 = (undefined1  [8])0x0;
  local_128._20_4_ = stroke::vertex(&local_180,(real_t *)local_218,(real_t *)(local_218 + 4));
  local_128._12_8_ = local_218;
  local_210 = 0;
  local_218 = (undefined1  [8])0x0;
  local_128._32_4_ = stroke::vertex(&local_180,(real_t *)local_218,(real_t *)(local_218 + 4));
  local_128._24_8_ = local_218;
  local_210 = 0;
  local_218 = (undefined1  [8])0x0;
  local_fc = stroke::vertex(&local_180,(real_t *)local_218,(real_t *)(local_218 + 4));
  local_128._36_8_ = local_218;
  local_210 = 0;
  local_218 = (undefined1  [8])0x0;
  local_f0 = stroke::vertex(&local_180,(real_t *)local_218,(real_t *)(local_218 + 4));
  local_f8 = (pointer)local_218;
  local_210 = 0;
  local_218 = (undefined1  [8])0x0;
  local_e4 = stroke::vertex(&local_180,(real_t *)local_218,(real_t *)(local_218 + 4));
  local_ec = (pointer)local_218;
  local_218 = (undefined1  [8])0xc17d999a42d8999a;
  local_210 = 1;
  local_20c = 0xc165999a42d8999a;
  local_204 = 2;
  local_200 = 0xc165999ac0a00000;
  local_1f8 = 2;
  local_1f4 = 0xc17d999ac0a00000;
  local_1ec = 2;
  local_1e8 = 0;
  local_1e0 = 0x30;
  local_1dc = 0;
  local_1d4 = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_e0,&local_70,0x80);
  lVar5 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)(local_218 + lVar5),(point *)(local_128 + lVar5));
    if (!bVar2) {
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,&local_50,&local_e0);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  stroke::~stroke(&local_180);
  return;
}

Assistant:

test( HorizontalLineIsTransformedToARect )
			{
				// INIT
				stroke s;

				s.width(2.1f);
				s.set_cap(caps::butt());

				// ACT
				move_to(s, 1.3f, 5.81f);
				line_to(s, 7.1f, 5.81f);
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.3f, 6.86f), lineto(1.3f, 4.76f),
					lineto(7.1f, 4.76f), lineto(7.1f, 6.86f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.width(1.5f);
				s.remove_all();

				// ACT
				move_to(s, 108.3f, -15.1f);
				line_to(s, -5.0f, -15.1f);
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(108.3f, -15.85f), lineto(108.3f, -14.35f),
					lineto(-5.0f, -14.35f), lineto(-5.0f, -15.85f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}